

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aeskey.c
# Opt level: O0

int aes_decrypt_key128(uchar *key,aes_decrypt_ctx *cx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t ss [5];
  aes_decrypt_ctx *cx_local;
  uchar *key_local;
  
  uVar7 = (uint)key[3] << 0x18 | (uint)key[2] << 0x10 | (uint)key[1] << 8 | (uint)*key;
  cx->ks[0x28] = uVar7;
  uVar8 = (uint)key[7] << 0x18 | (uint)key[6] << 0x10 | (uint)key[5] << 8 | (uint)key[4];
  cx->ks[0x29] = uVar8;
  uVar9 = (uint)key[0xb] << 0x18 | (uint)key[10] << 0x10 | (uint)key[9] << 8 | (uint)key[8];
  cx->ks[0x2a] = uVar9;
  bVar1 = key[0xf];
  bVar2 = key[0xe];
  bVar3 = key[0xd];
  bVar4 = key[0xc];
  uVar10 = (uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4;
  cx->ks[0x2b] = uVar10;
  uVar5 = t_fl[0][(uint)bVar3] ^ t_fl[1][(uint)bVar2] ^ t_fl[2][(uint)bVar1] ^ t_fl[3][(uint)bVar4]
          ^ 1;
  uVar6 = uVar5 ^ uVar7 ^ uVar9 ^ uVar8 ^ uVar10;
  uVar5 = cx->ks[0x28] ^ uVar5;
  cx->ks[0x24] = t_im[0][uVar5 & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^ t_im[2][uVar5 >> 0x10 & 0xff]
                 ^ t_im[3][uVar5 >> 0x18];
  uVar5 = cx->ks[0x29] ^ uVar5;
  cx->ks[0x25] = t_im[0][uVar5 & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^ t_im[2][uVar5 >> 0x10 & 0xff]
                 ^ t_im[3][uVar5 >> 0x18];
  uVar5 = cx->ks[0x2a] ^ uVar5;
  cx->ks[0x26] = t_im[0][uVar5 & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^ t_im[2][uVar5 >> 0x10 & 0xff]
                 ^ t_im[3][uVar5 >> 0x18];
  uVar5 = cx->ks[0x2b] ^ uVar5;
  cx->ks[0x27] = t_im[0][uVar5 & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^ t_im[2][uVar5 >> 0x10 & 0xff]
                 ^ t_im[3][uVar5 >> 0x18];
  uVar5 = t_fl[0][uVar6 >> 8 & 0xff] ^ t_fl[1][uVar6 >> 0x10 & 0xff] ^ t_fl[2][uVar6 >> 0x18] ^
          t_fl[3][uVar6 & 0xff];
  uVar8 = uVar5 ^ 2 ^ uVar8 ^ uVar10;
  uVar5 = cx->ks[0x24] ^
          t_im[0][(uVar5 ^ 2) & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^ t_im[2][uVar5 >> 0x10 & 0xff] ^
          t_im[3][uVar5 >> 0x18];
  cx->ks[0x20] = uVar5;
  uVar5 = cx->ks[0x25] ^ uVar5;
  cx->ks[0x21] = uVar5;
  uVar5 = cx->ks[0x26] ^ uVar5;
  cx->ks[0x22] = uVar5;
  cx->ks[0x23] = cx->ks[0x27] ^ uVar5;
  uVar5 = t_fl[0][uVar8 >> 8 & 0xff] ^ t_fl[1][uVar8 >> 0x10 & 0xff] ^ t_fl[2][uVar8 >> 0x18] ^
          t_fl[3][uVar8 & 0xff];
  uVar7 = uVar5 ^ 4 ^ uVar9 ^ uVar10;
  uVar5 = cx->ks[0x20] ^
          t_im[0][(uVar5 ^ 4) & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^ t_im[2][uVar5 >> 0x10 & 0xff] ^
          t_im[3][uVar5 >> 0x18];
  cx->ks[0x1c] = uVar5;
  uVar5 = cx->ks[0x21] ^ uVar5;
  cx->ks[0x1d] = uVar5;
  uVar5 = cx->ks[0x22] ^ uVar5;
  cx->ks[0x1e] = uVar5;
  cx->ks[0x1f] = cx->ks[0x23] ^ uVar5;
  uVar5 = t_fl[0][uVar7 >> 8 & 0xff] ^ t_fl[1][uVar7 >> 0x10 & 0xff] ^ t_fl[2][uVar7 >> 0x18] ^
          t_fl[3][uVar7 & 0xff];
  uVar10 = uVar5 ^ 8 ^ uVar10;
  uVar5 = cx->ks[0x1c] ^
          t_im[0][(uVar5 ^ 8) & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^ t_im[2][uVar5 >> 0x10 & 0xff] ^
          t_im[3][uVar5 >> 0x18];
  cx->ks[0x18] = uVar5;
  uVar5 = cx->ks[0x1d] ^ uVar5;
  cx->ks[0x19] = uVar5;
  uVar5 = cx->ks[0x1e] ^ uVar5;
  cx->ks[0x1a] = uVar5;
  cx->ks[0x1b] = cx->ks[0x1f] ^ uVar5;
  uVar5 = t_fl[0][uVar10 >> 8 & 0xff] ^ t_fl[1][uVar10 >> 0x10 & 0xff] ^ t_fl[2][uVar10 >> 0x18] ^
          t_fl[3][uVar10 & 0xff];
  uVar6 = uVar5 ^ 0x10 ^ uVar6;
  uVar5 = cx->ks[0x18] ^
          t_im[0][(uVar5 ^ 0x10) & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^
          t_im[2][uVar5 >> 0x10 & 0xff] ^ t_im[3][uVar5 >> 0x18];
  cx->ks[0x14] = uVar5;
  uVar5 = cx->ks[0x19] ^ uVar5;
  cx->ks[0x15] = uVar5;
  uVar5 = cx->ks[0x1a] ^ uVar5;
  cx->ks[0x16] = uVar5;
  cx->ks[0x17] = cx->ks[0x1b] ^ uVar5;
  uVar5 = t_fl[0][uVar6 >> 8 & 0xff] ^ t_fl[1][uVar6 >> 0x10 & 0xff] ^ t_fl[2][uVar6 >> 0x18] ^
          t_fl[3][uVar6 & 0xff];
  uVar8 = uVar5 ^ 0x20 ^ uVar8;
  uVar5 = cx->ks[0x14] ^
          t_im[0][(uVar5 ^ 0x20) & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^
          t_im[2][uVar5 >> 0x10 & 0xff] ^ t_im[3][uVar5 >> 0x18];
  cx->ks[0x10] = uVar5;
  uVar5 = cx->ks[0x15] ^ uVar5;
  cx->ks[0x11] = uVar5;
  uVar5 = cx->ks[0x16] ^ uVar5;
  cx->ks[0x12] = uVar5;
  cx->ks[0x13] = cx->ks[0x17] ^ uVar5;
  uVar5 = t_fl[0][uVar8 >> 8 & 0xff] ^ t_fl[1][uVar8 >> 0x10 & 0xff] ^ t_fl[2][uVar8 >> 0x18] ^
          t_fl[3][uVar8 & 0xff];
  uVar7 = uVar5 ^ 0x40 ^ uVar7;
  uVar5 = cx->ks[0x10] ^
          t_im[0][(uVar5 ^ 0x40) & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^
          t_im[2][uVar5 >> 0x10 & 0xff] ^ t_im[3][uVar5 >> 0x18];
  cx->ks[0xc] = uVar5;
  uVar5 = cx->ks[0x11] ^ uVar5;
  cx->ks[0xd] = uVar5;
  uVar5 = cx->ks[0x12] ^ uVar5;
  cx->ks[0xe] = uVar5;
  cx->ks[0xf] = cx->ks[0x13] ^ uVar5;
  uVar5 = t_fl[0][uVar7 >> 8 & 0xff] ^ t_fl[1][uVar7 >> 0x10 & 0xff] ^ t_fl[2][uVar7 >> 0x18] ^
          t_fl[3][uVar7 & 0xff];
  uVar10 = uVar5 ^ 0x80 ^ uVar10;
  uVar5 = cx->ks[0xc] ^
          t_im[0][(uVar5 ^ 0x80) & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^
          t_im[2][uVar5 >> 0x10 & 0xff] ^ t_im[3][uVar5 >> 0x18];
  cx->ks[8] = uVar5;
  uVar5 = cx->ks[0xd] ^ uVar5;
  cx->ks[9] = uVar5;
  uVar5 = cx->ks[0xe] ^ uVar5;
  cx->ks[10] = uVar5;
  cx->ks[0xb] = cx->ks[0xf] ^ uVar5;
  uVar5 = t_fl[0][uVar10 >> 8 & 0xff] ^ t_fl[1][uVar10 >> 0x10 & 0xff] ^ t_fl[2][uVar10 >> 0x18] ^
          t_fl[3][uVar10 & 0xff];
  uVar6 = uVar5 ^ 0x1b ^ uVar6;
  uVar5 = cx->ks[8] ^
          t_im[0][(uVar5 ^ 0x1b) & 0xff] ^ t_im[1][uVar5 >> 8 & 0xff] ^
          t_im[2][uVar5 >> 0x10 & 0xff] ^ t_im[3][uVar5 >> 0x18];
  cx->ks[4] = uVar5;
  uVar5 = cx->ks[9] ^ uVar5;
  cx->ks[5] = uVar5;
  uVar5 = cx->ks[10] ^ uVar5;
  cx->ks[6] = uVar5;
  cx->ks[7] = cx->ks[0xb] ^ uVar5;
  uVar8 = t_fl[0][uVar6 >> 8 & 0xff] ^ t_fl[1][uVar6 >> 0x10 & 0xff] ^ t_fl[2][uVar6 >> 0x18] ^
          t_fl[3][uVar6 & 0xff] ^ 0x36 ^ uVar8;
  cx->ks[0] = uVar8 ^ uVar6 ^ uVar7 ^ uVar10;
  cx->ks[1] = uVar8 ^ uVar10;
  cx->ks[2] = uVar8 ^ uVar6;
  cx->ks[3] = uVar8;
  (cx->inf).l = 0;
  (cx->inf).b[0] = 0xa0;
  return 0;
}

Assistant:

AES_RETURN aes_xi(decrypt_key128)(const unsigned char *key, aes_decrypt_ctx cx[1])
{   uint32_t    ss[5];
#if defined( d_vars )
        d_vars;
#endif

	cx->ks[v(40,(0))] = ss[0] = word_in(key, 0);
    cx->ks[v(40,(1))] = ss[1] = word_in(key, 1);
    cx->ks[v(40,(2))] = ss[2] = word_in(key, 2);
    cx->ks[v(40,(3))] = ss[3] = word_in(key, 3);

#ifdef DEC_KS_UNROLL
     kdf4(cx->ks, 0); kd4(cx->ks, 1);
     kd4(cx->ks, 2);  kd4(cx->ks, 3);
     kd4(cx->ks, 4);  kd4(cx->ks, 5);
     kd4(cx->ks, 6);  kd4(cx->ks, 7);
     kd4(cx->ks, 8);  kdl4(cx->ks, 9);
#else
    {   uint32_t i;
        for(i = 0; i < 10; ++i)
            k4e(cx->ks, i);
#if !(DEC_ROUND == NO_TABLES)
        for(i = N_COLS; i < 10 * N_COLS; ++i)
            cx->ks[i] = inv_mcol(cx->ks[i]);
#endif
    }
#endif
    cx->inf.l = 0;
    cx->inf.b[0] = 10 * 16;

#ifdef USE_VIA_ACE_IF_PRESENT
    if(VIA_ACE_AVAILABLE)
        cx->inf.b[1] = 0xff;
#endif
    return EXIT_SUCCESS;
}